

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

int32_t __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
              *this,int32_t start_index,decoder_strategy *param_2)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  triplet<unsigned_char> tVar5;
  int32_t iVar6;
  uint uVar7;
  pixel_type *ppVar8;
  triplet<unsigned_char> local_54;
  triplet<unsigned_char> local_50;
  pixel_type rb;
  uint32_t end_index;
  int32_t run_length;
  pixel_type ra;
  decoder_strategy *param_2_local;
  int32_t start_index_local;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
  *this_local;
  
  rb.field_2 = (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)
               this->current_line_[start_index + -1].field_2.v3;
  ppVar8 = this->current_line_ + (start_index + -1);
  uVar1 = ppVar8->field_0;
  uVar3 = ppVar8->field_1;
  local_50.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar3;
  local_50.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar1;
  rb.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar1;
  rb.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar3;
  iVar6 = decode_run_pixels(this,rb,this->current_line_ + start_index,this->width_ - start_index);
  uVar7 = start_index + iVar6;
  if (uVar7 == this->width_) {
    this_local._4_4_ = uVar7 - start_index;
  }
  else {
    ppVar8 = this->previous_line_ + uVar7;
    uVar2 = ppVar8->field_0;
    uVar4 = ppVar8->field_1;
    local_54.field_1 = (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)uVar4;
    local_54.field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)uVar2;
    local_50.field_2 =
         (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)
         (anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5)rb.field_2.v3;
    local_54.field_2.v3 = this->previous_line_[uVar7].field_2.v3;
    tVar5 = decode_run_interruption_pixel(this,local_50,local_54);
    ppVar8 = this->current_line_ + uVar7;
    ppVar8->field_0 = (anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1)(char)tVar5._0_2_;
    ppVar8->field_1 =
         (anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3)(char)((ushort)tVar5._0_2_ >> 8);
    (ppVar8->field_2).v3 = (uchar)tVar5.field_2;
    decrement_run_index(this);
    this_local._4_4_ = (uVar7 - start_index) + 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t do_run_mode(const int32_t start_index, decoder_strategy* /*template_selector*/)
    {
        const pixel_type ra{current_line_[start_index - 1]};

        const int32_t run_length{decode_run_pixels(ra, current_line_ + start_index, width_ - start_index)};
        const uint32_t end_index{static_cast<uint32_t>(start_index + run_length)};

        if (end_index == width_)
            return end_index - start_index;

        // run interruption
        const pixel_type rb{previous_line_[end_index]};
        current_line_[end_index] = decode_run_interruption_pixel(ra, rb);
        decrement_run_index();
        return end_index - start_index + 1;
    }